

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.h
# Opt level: O1

void __thiscall CNscContext::MarkGlobalIdentifierSymbol(CNscContext *this,NscSymbol *pSymbol)

{
  int iVar1;
  
  iVar1 = this->m_nGlobalIdentifierCount + 1;
  this->m_nGlobalIdentifierCount = iVar1;
  if ((this->m_nMaxIdentifierCount <= iVar1) && (this->m_fWarnedTooManyIdentifiers == false)) {
    this->m_fWarnedTooManyIdentifiers = true;
    GenerateWarning(this,
                    "Number of identifiers exceeds the standard compiler\'s maximum internal limit (%d); the standard compiler may not be able to compile the script.  Consider removing excess functions, global variables, constants, or structure types."
                   );
    return;
  }
  return;
}

Assistant:

void MarkGlobalIdentifierSymbol (NscSymbol *pSymbol)
	{
		pSymbol;

		m_nGlobalIdentifierCount += 1;

		if (m_nGlobalIdentifierCount >= m_nMaxIdentifierCount &&
			m_fWarnedTooManyIdentifiers == false)
		{
			m_fWarnedTooManyIdentifiers = true;

			GenerateWarning (
				"Number of identifiers exceeds the standard compiler's maximum"
				" internal limit (%d); the standard compiler may not be able"
				" to compile the script.  Consider removing excess functions,"
				" global variables, constants, or structure types.",
				m_nMaxIdentifierCount);
		}
	}